

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O0

void FT_GlyphLoader_Adjust_Points(FT_GlyphLoader loader)

{
  FT_Outline *current;
  FT_Outline *base;
  FT_GlyphLoader loader_local;
  
  (loader->current).outline.points =
       (loader->base).outline.points + (int)(loader->base).outline.n_points;
  (loader->current).outline.tags =
       (loader->base).outline.tags + (int)(loader->base).outline.n_points;
  (loader->current).outline.contours =
       (loader->base).outline.contours + (int)(loader->base).outline.n_contours;
  if (loader->use_extra != '\0') {
    (loader->current).extra_points =
         (loader->base).extra_points + (int)(loader->base).outline.n_points;
    (loader->current).extra_points2 =
         (loader->base).extra_points2 + (int)(loader->base).outline.n_points;
  }
  return;
}

Assistant:

static void
  FT_GlyphLoader_Adjust_Points( FT_GlyphLoader  loader )
  {
    FT_Outline*  base    = &loader->base.outline;
    FT_Outline*  current = &loader->current.outline;


    current->points   = base->points   + base->n_points;
    current->tags     = base->tags     + base->n_points;
    current->contours = base->contours + base->n_contours;

    /* handle extra points table - if any */
    if ( loader->use_extra )
    {
      loader->current.extra_points  = loader->base.extra_points +
                                      base->n_points;

      loader->current.extra_points2 = loader->base.extra_points2 +
                                      base->n_points;
    }
  }